

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiAnalyzer.cpp
# Opt level: O0

void __thiscall MidiAnalyzer::WorkerThread(MidiAnalyzer *this)

{
  uint uVar1;
  U32 UVar2;
  int iVar3;
  MarkerType MVar4;
  AnalyzerChannelData *pAVar5;
  element_type *peVar6;
  undefined8 uVar7;
  element_type *peVar8;
  undefined8 local_68;
  Frame frame;
  uint local_3c;
  U32 i;
  U64 starting_sample;
  stash stash1;
  byte local_1e;
  byte local_1d;
  MidiFrameType FrameType;
  U8 mask;
  uint uStack_18;
  U8 data;
  U32 samples_to_first_center_of_first_data_bit;
  U32 samples_per_bit;
  bool BigEndian;
  unsigned_short DataBits;
  MidiAnalyzer *this_local;
  
  _samples_per_bit = this;
  UVar2 = Analyzer::GetSampleRate();
  this->mSampleRateHz = UVar2;
  std::auto_ptr<MidiAnalyzerSettings>::operator->(&this->mSettings);
  pAVar5 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mSerial = pAVar5;
  iVar3 = AnalyzerChannelData::GetBitState();
  if (iVar3 == 0) {
    AnalyzerChannelData::AdvanceToNextEdge();
  }
  samples_to_first_center_of_first_data_bit._2_2_ = 8;
  samples_to_first_center_of_first_data_bit._1_1_ = 0;
  uVar1 = this->mSampleRateHz;
  peVar6 = std::auto_ptr<MidiAnalyzerSettings>::operator->(&this->mSettings);
  uStack_18 = uVar1 / peVar6->mBitRate;
  uVar1 = this->mSampleRateHz;
  peVar6 = std::auto_ptr<MidiAnalyzerSettings>::operator->(&this->mSettings);
  FrameType = (MidiFrameType)(long)(((double)uVar1 * 1.5) / (double)peVar6->mBitRate);
  do {
    local_1d = 0;
    if ((samples_to_first_center_of_first_data_bit._1_1_ & 1) == 0) {
      local_1e = 1;
    }
    else {
      local_1e = 0x80;
    }
    AnalyzerChannelData::AdvanceToNextEdge();
    uVar7 = AnalyzerChannelData::GetSampleNumber();
    AnalyzerChannelData::Advance((uint)this->mSerial);
    for (local_3c = 0; local_3c < samples_to_first_center_of_first_data_bit._2_2_;
        local_3c = local_3c + 1) {
      peVar8 = std::auto_ptr<MidiAnalyzerResults>::operator->(&this->mResults);
      MVar4 = AnalyzerChannelData::GetSampleNumber();
      std::auto_ptr<MidiAnalyzerSettings>::operator->(&this->mSettings);
      AnalyzerResults::AddMarker((ulonglong)peVar8,MVar4,(Channel *)0x0);
      iVar3 = AnalyzerChannelData::GetBitState();
      if (iVar3 == 1) {
        local_1d = local_1d | local_1e;
      }
      AnalyzerChannelData::Advance((uint)this->mSerial);
      if ((samples_to_first_center_of_first_data_bit._1_1_ & 1) == 0) {
        local_1e = local_1e << 1;
      }
      else {
        local_1e = (byte)((int)(uint)local_1e >> 1);
      }
    }
    stash1.mData2._4_4_ = 0x23;
    starting_sample._0_1_ = 0xf8;
    if (local_1d < 0x80) {
      dataParameter(this,local_1d,(MidiFrameType *)((long)&stash1 + 4),(stash *)&starting_sample);
    }
    else if ((local_1d & 0xf0) == 0xf0) {
      systemMessage(this,local_1d,(MidiFrameType *)((long)&stash1 + 4),(stash *)&starting_sample);
    }
    else {
      channelMessage(this,local_1d,(MidiFrameType *)((long)&stash1 + 4),(stash *)&starting_sample);
      this->distanceFromLastCommandPacket = 0;
    }
    Frame::Frame((Frame *)&local_68);
    local_68 = uVar7;
    _frame = AnalyzerChannelData::GetSampleNumber();
    peVar8 = std::auto_ptr<MidiAnalyzerResults>::operator->(&this->mResults);
    AnalyzerResults::AddFrame((Frame *)peVar8);
    std::auto_ptr<MidiAnalyzerResults>::operator->(&this->mResults);
    AnalyzerResults::CommitResults();
    Analyzer::ReportProgress((ulonglong)this);
    if (this->distanceFromLastCommandPacket != -1) {
      this->distanceFromLastCommandPacket = this->distanceFromLastCommandPacket + 1;
    }
    Frame::~Frame((Frame *)&local_68);
  } while( true );
}

Assistant:

void MidiAnalyzer::WorkerThread()
{
    mSampleRateHz = GetSampleRate();

    mSerial = GetAnalyzerChannelData( mSettings->mInputChannel );

    if( mSerial->GetBitState() == BIT_LOW )
        mSerial->AdvanceToNextEdge();

    // double Stop_Bits = mSettings->mStopBits;
    unsigned short DataBits = 8; // FIXME
    bool BigEndian = false;      // FIXME
    /*
     * Big endian / Little endian.
     * 31.25 kBaud, 1 start, 8 data, 1 stop bit.
     * Asynchronous
     */

    U32 samples_per_bit = mSampleRateHz / mSettings->mBitRate;
    U32 samples_to_first_center_of_first_data_bit = U32( 1.5 * double( mSampleRateHz ) / double( mSettings->mBitRate ) );
    // U8 dataQueue[5];				// Storage for previous frames, arranged in a FIFO.
    // memset( &dataQueue, 0, sizeof(dataQueue) );	// clear it.

    for( ;; )
    {
        U8 data = 0;
        U8 mask = 0;

        if( BigEndian )
            mask = 1 << 7;
        else
            mask = 1;

        enum MidiFrameType FrameType;
        union stash stash1;

        mSerial->AdvanceToNextEdge(); // falling edge -- beginning of the start bit
        U64 starting_sample = mSerial->GetSampleNumber();
        mSerial->Advance( samples_to_first_center_of_first_data_bit );

        for( U32 i = 0; i < DataBits; i++ )
        { // Read in data.
            // let's put a dot exactly where we sample this bit:
            mResults->AddMarker( mSerial->GetSampleNumber(), AnalyzerResults::Dot, mSettings->mInputChannel );
            if( mSerial->GetBitState() == BIT_HIGH )
            {
                data |= mask;
            }
            mSerial->Advance( samples_per_bit );

            if( BigEndian )
                mask = mask >> 1;
            else
                mask = mask << 1;
        }

        // Set defaults, debugging aid.
        FrameType = error;
        stash1.channel = -8;

        // Determine if data is a DATA byte or a COMMAND byte.
        if( data >= 0x80 )
        { // COMMAND byte.  Data has the MSB clear, Command bytes have it set.
            if( ( data & 0xF0 ) == 0xF0 )
            { // All system messages have 0xF in the high nibble.
                systemMessage( data, &FrameType, &stash1 );
            }
            else
            {
                channelMessage( data, &FrameType, &stash1 );
                distanceFromLastCommandPacket = 0;
            }
        }
        else
        { // DATA byte
            dataParameter( data, &FrameType, &stash1 );
        }

        // we have a byte to save.
        Frame frame;
        frame.mData1 = data;
        frame.mData2 = stash1.mData2;
        frame.mType = FrameType;
        frame.mFlags = 0;
        frame.mStartingSampleInclusive = starting_sample;
        frame.mEndingSampleInclusive = mSerial->GetSampleNumber();

        mResults->AddFrame( frame );
        mResults->CommitResults();
        ReportProgress( frame.mEndingSampleInclusive );

        if( distanceFromLastCommandPacket != -1 )
        {
            distanceFromLastCommandPacket++;
        }
    }
}